

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

bool * __thiscall google::protobuf::RepeatedField<bool>::elements(RepeatedField<bool> *this)

{
  LogMessage *other;
  bool *pbVar1;
  LogFinisher local_5d [20];
  byte local_49;
  LogMessage local_48;
  RepeatedField<bool> *local_10;
  RepeatedField<bool> *this_local;
  
  local_49 = 0;
  local_10 = this;
  if (this->total_size_ < 1) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x161);
    local_49 = 1;
    other = internal::LogMessage::operator<<(&local_48,"CHECK failed: (total_size_) > (0): ");
    internal::LogFinisher::operator=(local_5d,other);
  }
  if ((local_49 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_48);
  }
  pbVar1 = unsafe_elements(this);
  return pbVar1;
}

Assistant:

Element* elements() const {
    GOOGLE_DCHECK_GT(total_size_, 0);
    // Because of above pre-condition this cast is safe.
    return unsafe_elements();
  }